

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O2

type cm::operator!=(char **l,String *r)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  string_view __x;
  
  __x = AsStringView<char_*>::view(*l);
  __y._M_len = (r->view_)._M_len;
  __y._M_str = (r->view_)._M_str;
  bVar1 = std::operator!=(__x,__y);
  return bVar1;
}

Assistant:

typename std::enable_if<IsComparable<L>::value, bool>::type operator!=(
  L&& l, const String& r)
{
  return AsStringView<L>::view(std::forward<L>(l)) != r.view();
}